

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiero_console.cpp
# Opt level: O3

int main(void)

{
  size_t sVar1;
  char *pcVar2;
  pointer pPVar3;
  char cVar4;
  istream *piVar5;
  ostream *poVar6;
  PhrasalRule *rule;
  PhrasalRule *rule_00;
  string_view line_00;
  string line;
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> initial;
  AlignedSentencePair asp;
  char local_d1;
  undefined1 *local_d0;
  thrax *local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> local_b0;
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> local_98;
  Labeler local_80;
  AlignedSentencePair local_78;
  
  local_d0 = &local_c0;
  local_c8 = (thrax *)0x0;
  local_c0 = 0;
  local_80._vptr_Labeler = (_func_int **)&PTR_operator___00109d50;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_d0,cVar4);
    if (((byte)(piVar5 + 0x20)[(long)*(char **)(*(long *)piVar5 + -0x18)] & 5) != 0) break;
    line_00._M_str = *(char **)(*(long *)piVar5 + -0x18);
    line_00._M_len = (size_t)local_d0;
    jhu::thrax::readAlignedSentencePair<false,false>(&local_78,local_c8,line_00);
    jhu::thrax::minimalConsistentPairs(&local_98,&local_78.alignment,10);
    jhu::thrax::extract(&local_b0,&local_80,&local_78,&local_98);
    pPVar3 = local_b0.
             super__Vector_base<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (rule_00 = local_b0.
                   super__Vector_base<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>
                   ._M_impl.super__Vector_impl_data._M_start; rule_00 != pPVar3;
        rule_00 = rule_00 + 1) {
      sVar1 = (rule_00->lhs).label._M_len;
      pcVar2 = (rule_00->lhs).label._M_str;
      local_d1 = '[';
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_d1,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar2,sVar1);
      local_d1 = ']';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_d1,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      jhu::thrax::printRhs<true>((ostream *)&std::cout,rule_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      jhu::thrax::printRhs<false>((ostream *)&std::cout,rule_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      jhu::thrax::PhrasalRule::printAlignment(rule_00,(ostream *)&std::cout);
      local_d1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_d1,1);
    }
    if (local_b0.
        super__Vector_base<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>.
        _M_impl.super__Vector_impl_data._M_start != (PhrasalRule *)0x0) {
      operator_delete(local_b0.
                      super__Vector_base<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.
                            super__Vector_base<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.
                            super__Vector_base<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98.super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.alignment.
                      super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.alignment.
                            super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.alignment.
                            super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.tgt.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.tgt.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.tgt.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.tgt.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.src.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.src.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.src.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.src.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return 0;
}

Assistant:

int main() {
  std::string line;
  jhu::thrax::HieroLabeler hiero{};
  while (std::getline(std::cin, line)) {
    auto asp = jhu::thrax::readAlignedSentencePair<false, false>(line);
    auto initial = jhu::thrax::minimalConsistentPairs(asp.alignment, 10);
    for (const auto& rule : jhu::thrax::extract(hiero, asp, initial)) {
      std::cout << rule << '\n';
    }
  }
}